

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  aom_tune_metric tuning;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  double dVar11;
  int index_1;
  double scale_adj;
  double scaling_factor;
  int new_rdmult;
  int new_qindex_rdmult;
  int orig_rdmult;
  int orig_qindex_rdmult;
  CommonQuantParams *quant_params;
  int index;
  double log_sum;
  double base_block_count;
  int col;
  int row;
  int num_brows;
  int num_bcols;
  int num_rows;
  int num_cols;
  int num_mi_h;
  int num_mi_w;
  int bsize_base;
  int sb_mi_width_sr;
  int mi_cols_sr;
  int mi_col_sr;
  TplDepFrame *tpl_frame;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  int tpl_idx;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  FRAME_TYPE in_stack_fffffffffffffee3;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  FRAME_UPDATE_TYPE update_type;
  aom_bit_depth_t in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff08;
  int is_stat_consumption_stage;
  aom_tune_metric in_stack_ffffffffffffff10;
  int local_c4;
  int local_78;
  int local_74;
  
  lVar1 = *in_RDI;
  if (*(int *)(lVar1 + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 6) {
    local_c4 = *(int *)(lVar1 + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4);
  }
  else {
    local_c4 = 6;
  }
  lVar2 = in_RDI[0x77f0];
  if ((((*(byte *)(in_RDI + 0xe258) < 0x60) &&
       (*(char *)(*(long *)(*in_RDI + 0x12298) + (long)(int)(uint)*(byte *)(in_RDI + 0xe258) * 0x60)
        != '\0')) &&
      (iVar3 = is_frame_tpl_eligible((GF_GROUP *)(lVar1 + 400),(uint8_t)in_RDI[0xe258]), iVar3 != 0)
      ) && ((char)in_RDI[0x8480] == '\0')) {
    iVar3 = coded_to_superres_mi(in_R8D,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar4 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
    iVar5 = coded_to_superres_mi
                      ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [in_DL],(uint)*(byte *)(in_RDI + 0x77fa));
    iVar4 = (iVar4 + 3) / 4;
    iVar6 = (*(int *)((long)in_RDI + 0x3c194) + 3) / 4;
    iVar5 = (iVar5 + 3) / 4;
    uVar7 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL] + 3
            ) / 4;
    for (local_74 = in_ECX / 4;
        update_type = (FRAME_UPDATE_TYPE)((uint)in_stack_fffffffffffffeec >> 0x18),
        local_74 < iVar6 && local_74 < (int)(in_ECX / 4 + uVar7); local_74 = local_74 + 1) {
      for (local_78 = iVar3 / 4; local_78 < iVar4 && local_78 < iVar3 / 4 + iVar5;
          local_78 = local_78 + 1) {
        log(*(double *)(in_RDI[0x8549] + (long)(local_74 * iVar4 + local_78) * 8));
      }
    }
    iVar8 = (int)in_RDI[0x783d] + (int)in_RDI[0x783e];
    is_stat_consumption_stage = CONCAT13((char)lVar2,(int3)in_stack_ffffffffffffff08);
    iVar9 = ::is_stat_consumption_stage
                      ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar10 = av1_compute_rd_mult(iVar8,in_stack_fffffffffffffef0,update_type,
                                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                                 in_stack_fffffffffffffee3,local_c4,is_stat_consumption_stage,
                                 in_stack_ffffffffffffff10);
    tuning = (int)in_RDI[0x783d] + *(int *)(in_RSI + 0x4210) + (int)in_RDI[0x783e];
    uVar12 = (undefined4)in_RDI[0x847e];
    ::is_stat_consumption_stage((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,iVar9));
    iVar8 = av1_compute_rd_mult(iVar8,in_stack_fffffffffffffef0,update_type,
                                in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                                in_stack_fffffffffffffee3,local_c4,is_stat_consumption_stage,tuning)
    ;
    log((double)iVar8 / (double)iVar10);
    dVar11 = exp_bounded((double)CONCAT44(in_stack_fffffffffffffecc,uVar12));
    for (local_74 = in_ECX / 4; local_74 < iVar6 && local_74 < (int)(in_ECX / 4 + uVar7);
        local_74 = local_74 + 1) {
      for (local_78 = iVar3 / 4; local_78 < iVar4 && local_78 < iVar3 / 4 + iVar5;
          local_78 = local_78 + 1) {
        iVar8 = local_74 * iVar4 + local_78;
        *(double *)(*(long *)(*in_RDI + 0xd2a0) + (long)iVar8 * 8) =
             dVar11 * *(double *)(in_RDI[0x8549] + (long)iVar8 * 8);
      }
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup_sb(AV1_COMP *cpi, MACROBLOCK *const x,
                             BLOCK_SIZE sb_size, int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;

  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return;
  TplDepFrame *tpl_frame = &cpi->ppi->tpl_data.tpl_frame[tpl_idx];
  if (!tpl_frame->is_valid) return;
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) return;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return;

  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int sb_mi_width_sr = coded_to_superres_mi(
      mi_size_wide[sb_size], cm->superres_scale_denominator);

  const int bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (sb_mi_width_sr + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[sb_size] + num_mi_h - 1) / num_mi_h;
  int row, col;

  double base_block_count = 0.0;
  double log_sum = 0.0;

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      log_sum += log(cpi->tpl_rdmult_scaling_factors[index]);
      base_block_count += 1.0;
    }
  }

  const CommonQuantParams *quant_params = &cm->quant_params;

  const int orig_qindex_rdmult =
      quant_params->base_qindex + quant_params->y_dc_delta_q;
  const int orig_rdmult = av1_compute_rd_mult(
      orig_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int new_qindex_rdmult = quant_params->base_qindex +
                                x->rdmult_delta_qindex +
                                quant_params->y_dc_delta_q;
  const int new_rdmult = av1_compute_rd_mult(
      new_qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const double scaling_factor = (double)new_rdmult / (double)orig_rdmult;

  double scale_adj = log(scaling_factor) - log_sum / base_block_count;
  scale_adj = exp_bounded(scale_adj);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col_sr / num_mi_h;
         col < num_cols && col < mi_col_sr / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      cpi->ppi->tpl_sb_rdmult_scaling_factors[index] =
          scale_adj * cpi->tpl_rdmult_scaling_factors[index];
    }
  }
}